

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::advance
          (SimpleParser<avro::parsing::JsonHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Kind KVar1;
  ProductionPtr *ss;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar2;
  size_t n;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar3;
  ostream *poVar4;
  Exception *this_01;
  _Elt_pointer pSVar5;
  Symbol *s;
  undefined1 auVar6 [16];
  string sStack_1c8;
  ostringstream oss;
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
  do {
    while( true ) {
      pSVar5 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar5 == (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar5 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      KVar1 = pSVar5[-1].kind_;
      if (KVar1 == k) goto LAB_001b3fd3;
      if (KVar1 - sNull < 0xf) break;
      switch(KVar1) {
      case sRoot:
        ss = (ProductionPtr *)
             boost::
             any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&pSVar5[-1].extra_);
        append(this,ss);
        break;
      case sRepeater:
        ptVar2 = boost::
                 any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           (&pSVar5[-1].extra_);
        (ptVar2->super_type).head = (ptVar2->super_type).head - 1;
        append(this,&(ptVar2->super_type).tail.tail.head);
        break;
      case sIndirect:
        boost::
        any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                  ((boost *)&oss,&pSVar5[-1].extra_);
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        append(this,(ProductionPtr *)&oss);
        boost::detail::shared_count::~shared_count(local_1a0);
        break;
      case sSymbolic:
        boost::
        any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                  ((boost *)&sStack_1c8,&pSVar5[-1].extra_);
        boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
        ::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                    *)&oss,(weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                            *)&sStack_1c8);
        boost::detail::weak_count::~weak_count((weak_count *)&sStack_1c8._M_string_length);
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        append(this,(ProductionPtr *)&oss);
        boost::detail::shared_count::~shared_count(local_1a0);
        break;
      case sSkipStart:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        skip(this,this->decoder_);
        break;
      case sResolve:
        ppVar3 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                           (&pSVar5[-1].extra_);
        assertMatch(ppVar3->second,k);
        k = ppVar3->first;
LAB_001b3fd3:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        return k;
      default:
        if (KVar1 == sError) {
          auVar6 = __cxa_allocate_exception(0x18);
          boost::any_cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     (boost *)&pSVar5[-1].extra_,auVar6._8_8_);
          Exception::Exception(auVar6._0_8_,(string *)&oss);
          __cxa_throw(auVar6._0_8_,&Exception::typeinfo,Exception::~Exception);
        }
      case sAlternative:
      case sPlaceholder:
      case sEnumAdjust:
      case sUnionAdjust:
        s = pSVar5 + -1;
        if (7 < KVar1 - sRecordStart) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar4 = std::operator<<((ostream *)&oss,"Encountered ");
          poVar4 = std::operator<<(poVar4,*(char **)(Symbol::stringValues + (ulong)s->kind_ * 8));
          poVar4 = std::operator<<(poVar4," while looking for ");
          std::operator<<(poVar4,*(char **)(Symbol::stringValues + (ulong)k * 8));
          this_01 = (Exception *)__cxa_allocate_exception(0x18);
          std::__cxx11::stringbuf::str();
          Exception::Exception(this_01,&sStack_1c8);
          __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
        }
        n = JsonHandler::handle(this->handler_,s);
        KVar1 = s->kind_;
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        if (KVar1 == sWriterUnion) {
          selectBranch(this,n);
        }
      }
    }
    throwMismatch(k,KVar1);
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }